

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O1

void __thiscall
amrex::PODVector<double,_std::allocator<double>_>::AllocateBuffer
          (PODVector<double,_std::allocator<double>_> *this,size_type a_capacity)

{
  double *__dest;
  
  __dest = __gnu_cxx::new_allocator<double>::allocate
                     ((new_allocator<double> *)this,a_capacity,(void *)0x0);
  if (this->m_data != (pointer)0x0) {
    memcpy(__dest,this->m_data,this->m_size << 3);
    Gpu::Device::streamSynchronize();
  }
  operator_delete(this->m_data,this->m_capacity << 3);
  this->m_data = __dest;
  this->m_capacity = a_capacity;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }